

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColecoVision.cpp
# Opt level: O1

HalfCycles __thiscall
Coleco::Vision::ConcreteMachine::perform_machine_cycle
          (ConcreteMachine *this,PartialMachineCycle *cycle)

{
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *this_00;
  TMS9918<(TI::TMS::Personality)0> *pTVar1;
  atomic_flag *paVar2;
  uint8_t *puVar3;
  __atomic_flag_data_type _Var4;
  Operation OVar5;
  bool bVar6;
  uint8_t uVar7;
  ushort uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  pointer puVar12;
  ssize_t sVar13;
  long lVar14;
  uint uVar15;
  size_t sVar16;
  uint *__buf;
  uint *extraout_RDX;
  void *__buf_00;
  WrappedInt<HalfCycles> WVar17;
  long lVar18;
  HalfCycles HVar19;
  undefined1 local_40 [16];
  
  if (cycle->operation == ReadOpcode) {
    WVar17.length_ = 2;
  }
  else if ((cycle->operation != Output) || (WVar17.length_ = 0x3e, (~*cycle->address & 0xe0) != 0))
  {
    WVar17.length_ = 0;
  }
  lVar18 = (cycle->length).super_WrappedInt<HalfCycles>.length_ + WVar17.length_;
  this_00 = &this->vdp_;
  HVar19.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)
       ((this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + lVar18);
  (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
       (IntType)HVar19.super_WrappedInt<HalfCycles>.length_;
  (this->vdp_).is_flushed_ = false;
  lVar14 = (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_;
  lVar10 = lVar14 - lVar18;
  (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = lVar10;
  if (lVar10 == 0 || lVar14 < lVar18) {
    (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = lVar10;
    (this->vdp_).is_flushed_ = true;
    (this->vdp_).did_flush_ = true;
    (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
    pTVar1 = &(this->vdp_).object_;
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(pTVar1,HVar19);
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
    update_sequence_point(this_00);
    LOCK();
    paVar2 = &(this->vdp_).flush_concurrency_check_;
    _Var4 = (paVar2->super___atomic_flag_base)._M_i;
    (paVar2->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var4 != false) goto LAB_00318deb;
    if ((this->vdp_).is_flushed_ == false) {
      (this->vdp_).is_flushed_ = true;
      (this->vdp_).did_flush_ = true;
      HVar19.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(pTVar1,HVar19);
    }
    LOCK();
    (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    local_40._0_8_ = this_00;
    local_40._8_8_ = pTVar1;
    bVar6 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar1);
    if (((this->z80_).super_ProcessorBase.super_ProcessorStorage.nmi_line_ != bVar6) &&
       ((this->z80_).super_ProcessorBase.super_ProcessorStorage.nmi_line_ = bVar6, bVar6)) {
      puVar3 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
      *puVar3 = *puVar3 | 2;
    }
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_40);
  }
  lVar18 = lVar18 + (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_;
  (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = lVar18;
  OVar5 = cycle->operation;
  if (8 < (int)OVar5) {
    return (HalfCycles)WVar17.length_;
  }
  if (cycle->address == (ushort *)0x0) {
    uVar11 = 0;
  }
  else {
    uVar11 = (ulong)*cycle->address;
  }
  if (Output < OVar5) {
    return (HalfCycles)WVar17.length_;
  }
  __buf = &switchD_003188d9::switchdataD_004c8af4;
  sVar16 = (long)&switchD_003188d9::switchdataD_004c8af4 +
           (long)(int)(&switchD_003188d9::switchdataD_004c8af4)[OVar5];
  uVar8 = (ushort)uVar11;
  uVar9 = (uint)uVar11;
  switch(OVar5) {
  case ReadOpcode:
    if (uVar8 == 0) {
      this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
    }
    break;
  case Write:
    if (((uVar9 < 0x2000 & (this->super_game_module_).replace_bios) == 1) ||
       ((0x1fff < (short)uVar8 & (this->super_game_module_).replace_ram) == 1)) {
      (this->super_game_module_).ram[uVar11] = *cycle->value;
      return (HalfCycles)WVar17.length_;
    }
    if (0x5fff < (short)uVar8) {
      this->ram_[uVar9 & 0x3ff] = *cycle->value;
      return (HalfCycles)WVar17.length_;
    }
    if ((0xffbf < uVar8 & this->is_megacart_) != 1) {
      return (HalfCycles)WVar17.length_;
    }
    puVar12 = (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    this->cartridge_pages_[1] =
         puVar12 + (ulong)((uVar9 & 0x3f) << 0xe) %
                   (ulong)((long)(this->cartridge_).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
    return (HalfCycles)WVar17.length_;
  case Input:
    uVar15 = (uint)(uVar11 >> 5) & 7;
    if (uVar15 == 7) {
      *cycle->value =
           *(uint8_t *)
            (*(long *)((long)&(((this->joysticks_).
                                super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                              ._M_t + (ulong)(uVar9 & 2) * 4) + 0x40 +
            (ulong)this->joysticks_in_keypad_mode_);
      if ((~uVar9 & 0xfc) != 0) {
        return (HalfCycles)WVar17.length_;
      }
      Analyser::Dynamic::ConfidenceCounter::add_hit(&this->confidence_counter_);
      return (HalfCycles)WVar17.length_;
    }
    if (uVar15 == 5) {
      LOCK();
      paVar2 = &(this->vdp_).flush_concurrency_check_;
      _Var4 = (paVar2->super___atomic_flag_base)._M_i;
      (paVar2->super___atomic_flag_base)._M_i = true;
      UNLOCK();
      if (_Var4 == false) {
        if ((this->vdp_).is_flushed_ == false) {
          (this->vdp_).is_flushed_ = true;
          (this->vdp_).did_flush_ = true;
          HVar19.super_WrappedInt<HalfCycles>.length_ =
               (WrappedInt<HalfCycles>)
               (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
          (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
          TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(&(this->vdp_).object_,HVar19);
          __buf = extraout_RDX;
        }
        LOCK();
        (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
        UNLOCK();
        pTVar1 = &(this->vdp_).object_;
        local_40._0_8_ = this_00;
        local_40._8_8_ = pTVar1;
        sVar13 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read(pTVar1,uVar9,__buf,sVar16);
        *cycle->value = (uint8_t)sVar13;
        std::
        unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
        ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                       *)local_40);
        LOCK();
        paVar2 = &(this->vdp_).flush_concurrency_check_;
        _Var4 = (paVar2->super___atomic_flag_base)._M_i;
        (paVar2->super___atomic_flag_base)._M_i = true;
        UNLOCK();
        if (_Var4 == false) {
          if ((this->vdp_).is_flushed_ == false) {
            (this->vdp_).is_flushed_ = true;
            (this->vdp_).did_flush_ = true;
            HVar19.super_WrappedInt<HalfCycles>.length_ =
                 (WrappedInt<HalfCycles>)
                 (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
            (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
            TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(pTVar1,HVar19);
          }
          LOCK();
          (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
          UNLOCK();
          local_40._0_8_ = this_00;
          local_40._8_8_ = pTVar1;
          bVar6 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(pTVar1);
          goto LAB_00318c3e;
        }
      }
LAB_00318deb:
      __assert_fail("!flush_concurrency_check_.test_and_set()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/ColecoVision/../../ClockReceiver/JustInTime.hpp"
                    ,0x7e,
                    "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::TMS9918A>>::operator->() [T = TI::TMS::TMS9918<TI::TMS::TMS9918A>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                   );
    }
    if ((char)uVar11 != 'R') goto LAB_00318bec;
    lVar14 = lVar18 + 3;
    if (-1 < lVar18) {
      lVar14 = lVar18;
    }
    (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = lVar18 % 4;
    Outputs::Speaker::
    PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>::
    run_for(&this->speaker_,&this->audio_queue_,(Cycles)(lVar14 >> 2));
    uVar7 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&this->ay_);
    goto LAB_00318aa5;
  case Output:
    uVar15 = (uint)(uVar11 >> 5) & 7;
    sVar16 = (size_t)uVar15;
    switch(uVar15) {
    case 4:
    case 6:
      this->joysticks_in_keypad_mode_ = uVar15 == 4;
      return (HalfCycles)WVar17.length_;
    case 5:
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_40);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_,uVar9,
                 (void *)(ulong)*cycle->value,sVar16);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_40);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_40);
      bVar6 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                        ((TMS9918<(TI::TMS::Personality)0> *)local_40._8_8_);
      break;
    case 7:
      lVar14 = lVar18 + 3;
      if (-1 < lVar18) {
        lVar14 = lVar18;
      }
      (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = lVar18 % 4;
      Outputs::Speaker::
      PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>::
      run_for(&this->speaker_,&this->audio_queue_,(Cycles)(lVar14 >> 2));
      TI::SN76489::write(&this->sn76489_,(uint)*cycle->value,__buf_00,sVar16);
      return (HalfCycles)WVar17.length_;
    default:
      uVar9 = uVar9 & 0xff;
      if (uVar9 < 0x53) {
        if (uVar9 == 0x50) {
          lVar14 = lVar18 + 3;
          if (-1 < lVar18) {
            lVar14 = lVar18;
          }
          (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = lVar18 % 4;
          Outputs::Speaker::
          PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>
          ::run_for(&this->speaker_,&this->audio_queue_,(Cycles)(lVar14 >> 2));
          uVar7 = *cycle->value;
          bVar6 = false;
        }
        else {
          if (uVar9 != 0x51) {
            return (HalfCycles)WVar17.length_;
          }
          lVar14 = lVar18 + 3;
          if (-1 < lVar18) {
            lVar14 = lVar18;
          }
          (this->time_since_sn76489_update_).super_WrappedInt<HalfCycles>.length_ = lVar18 % 4;
          Outputs::Speaker::
          PullLowpass<Outputs::Speaker::CompoundSource<TI::SN76489,_GI::AY38910::AY38910<false>_>_>
          ::run_for(&this->speaker_,&this->audio_queue_,(Cycles)(lVar14 >> 2));
          uVar7 = *cycle->value;
          bVar6 = true;
        }
        GI::AY38910::Utility::write<GI::AY38910::AY38910<false>>(&this->ay_,bVar6,uVar7);
        return (HalfCycles)WVar17.length_;
      }
      if (uVar9 == 0x53) {
        (this->super_game_module_).replace_ram = (bool)(*cycle->value & 1);
        return (HalfCycles)WVar17.length_;
      }
      if (uVar9 != 0x7f) {
        return (HalfCycles)WVar17.length_;
      }
      (this->super_game_module_).replace_bios = (*cycle->value & 2) == 0;
      return (HalfCycles)WVar17.length_;
    }
LAB_00318c3e:
    if (((this->z80_).super_ProcessorBase.super_ProcessorStorage.nmi_line_ != bVar6) &&
       ((this->z80_).super_ProcessorBase.super_ProcessorStorage.nmi_line_ = bVar6, bVar6 != false))
    {
      puVar3 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
      *puVar3 = *puVar3 | 2;
    }
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_40);
    return (HalfCycles)WVar17.length_;
  }
  if (uVar9 < 0x2000) {
    if ((this->super_game_module_).replace_bios == true) {
LAB_00318a9d:
      uVar7 = (this->super_game_module_).ram[uVar11];
      goto LAB_00318aa5;
    }
    puVar12 = (this->bios_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    if ((-1 < (short)uVar8 & (this->super_game_module_).replace_ram) == 1) goto LAB_00318a9d;
    if (0x5fff < (short)uVar8) {
      uVar7 = this->ram_[uVar9 & 0x3ff];
      goto LAB_00318aa5;
    }
    if ((-1 < (short)uVar8) || (this->cartridge_address_limit_ < uVar8)) {
LAB_00318bec:
      *cycle->value = 0xff;
      return (HalfCycles)WVar17.length_;
    }
    if ((0xffbf < uVar8 & this->is_megacart_) == 1) {
      puVar12 = (this->cartridge_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start;
      this->cartridge_pages_[1] =
           puVar12 + (ulong)((uVar9 & 0x3f) << 0xe) %
                     (ulong)((long)(this->cartridge_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar12);
    }
    puVar12 = *(pointer *)((long)this->cartridge_pages_ + (ulong)((uint)(uVar11 >> 0xb) & 8));
    uVar11 = (ulong)(uVar9 & 0x3fff);
  }
  uVar7 = puVar12[uVar11];
LAB_00318aa5:
  *cycle->value = uVar7;
  return (HalfCycles)(WrappedInt<HalfCycles>)WVar17.length_;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// The SN76489 will use its ready line to trigger the Z80's wait, which will add
			// thirty-one (!) cycles when accessed. M1 cycles are extended by a single cycle.
			// This code works out the delay up front in order to simplify execution flow, though
			// technically this is a little duplicative.
			HalfCycles penalty(0);
			if(cycle.operation == CPU::Z80::PartialMachineCycle::Output && ((*cycle.address >> 5) & 7) == 7) {
				penalty = HalfCycles(62);
			} else if(cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) {
				penalty = HalfCycles(2);
			}
			const HalfCycles length = cycle.length + penalty;

			if(vdp_ += length) {
				z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
			}
			time_since_sn76489_update_ += length;

			// Act only if necessary.
			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(!address) pc_zero_accesses_++;
						[[fallthrough]];
					case CPU::Z80::PartialMachineCycle::Read:
						if(address < 0x2000) {
							if(super_game_module_.replace_bios) {
								*cycle.value = super_game_module_.ram[address];
							} else {
								*cycle.value = bios_[address];
							}
						} else if(super_game_module_.replace_ram && address < 0x8000) {
							*cycle.value = super_game_module_.ram[address];
						} else if(address >= 0x6000 && address < 0x8000) {
							*cycle.value = ram_[address & 1023];
						} else if(address >= 0x8000 && address <= cartridge_address_limit_) {
							if(is_megacart_ && address >= 0xffc0) {
								page_megacart(address);
							}
							*cycle.value = cartridge_pages_[(address >> 14)&1][address&0x3fff];
						} else {
							*cycle.value = 0xff;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write:
						if(super_game_module_.replace_bios && address < 0x2000) {
							super_game_module_.ram[address] = *cycle.value;
						} else if(super_game_module_.replace_ram && address >= 0x2000 && address < 0x8000) {
							super_game_module_.ram[address] = *cycle.value;
						} else if(address >= 0x6000 && address < 0x8000) {
							ram_[address & 1023] = *cycle.value;
						} else if(is_megacart_ && address >= 0xffc0) {
							page_megacart(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch((address >> 5) & 7) {
							case 5:
								*cycle.value = vdp_->read(address);
								z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 7: {
								const std::size_t joystick_id = (address&2) >> 1;
								Joystick *joystick = static_cast<Joystick *>(joysticks_[joystick_id].get());
								if(joysticks_in_keypad_mode_) {
									*cycle.value = joystick->get_keypad_input();
								} else {
									*cycle.value = joystick->get_direction_input();
								}

								// Hitting exactly the recommended joypad input port is an indicator that
								// this really is a ColecoVision game. The BIOS won't do this when just waiting
								// to start a game (unlike accessing the VDP and SN).
								if((address&0xfc) == 0xfc) confidence_counter_.add_hit();
							} break;

							default:
								switch(address&0xff) {
									default: *cycle.value = 0xff; break;
									case 0x52:
										// Read AY data.
										update_audio();
										*cycle.value = GI::AY38910::Utility::read(ay_);
									break;
								}
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int eighth = (address >> 5) & 7;
						switch(eighth) {
							case 4: case 6:
								joysticks_in_keypad_mode_ = eighth == 4;
							break;

							case 5:
								vdp_->write(address, *cycle.value);
								z80_.set_non_maskable_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 7:
								update_audio();
								sn76489_.write(*cycle.value);
							break;

							default:
								// Catch Super Game Module accesses; it decodes more thoroughly.
								switch(address&0xff) {
									default: break;
									case 0x7f:
										super_game_module_.replace_bios = !((*cycle.value)&0x2);
									break;
									case 0x50:
										// Set AY address.
										update_audio();
										GI::AY38910::Utility::select_register(ay_, *cycle.value);
									break;
									case 0x51:
										// Set AY data.
										update_audio();
										GI::AY38910::Utility::write_data(ay_, *cycle.value);
									break;
									case 0x53:
										super_game_module_.replace_ram = !!((*cycle.value)&0x1);
									break;
								}
							break;
						}
					} break;

					default: break;
				}
			}

			return penalty;
		}